

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O0

vw * parse_args(options_i *options,trace_message_t trace_listener,void *trace_context)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  vw *pvVar5;
  parser *ppVar6;
  char *pfile;
  AllReduce *pAVar7;
  undefined8 in_RDX;
  long in_RSI;
  string *in_RDI;
  stringstream __msg;
  option_group_definition parallelization_args;
  size_t node_arg;
  size_t total_arg;
  size_t unique_id_arg;
  string span_server_arg;
  option_group_definition weight_args;
  option_group_definition update_args;
  option_group_definition vw_args;
  size_t ring_size;
  vw *all;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffdd08;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffdd10;
  string *in_stack_ffffffffffffdd18;
  undefined7 in_stack_ffffffffffffdd20;
  undefined1 in_stack_ffffffffffffdd27;
  string *in_stack_ffffffffffffdd28;
  undefined8 in_stack_ffffffffffffdd30;
  allocator *pnode;
  size_t in_stack_ffffffffffffdd38;
  undefined6 in_stack_ffffffffffffdd40;
  byte in_stack_ffffffffffffdd47;
  string *in_stack_ffffffffffffdd48;
  AllReduceSockets *in_stack_ffffffffffffdd50;
  undefined7 in_stack_ffffffffffffdd58;
  undefined1 in_stack_ffffffffffffdd5f;
  option_group_definition *in_stack_ffffffffffffdd60;
  string *psVar8;
  byte local_228a;
  byte local_2272;
  size_t in_stack_ffffffffffffde18;
  vw *in_stack_ffffffffffffde20;
  string local_1fb8 [39];
  allocator local_1f91;
  string local_1f90 [39];
  undefined1 local_1f69;
  stringstream local_1f48 [16];
  ostream local_1f38;
  byte local_1dbb;
  byte local_1dba;
  undefined1 local_1db9 [38];
  byte local_1d93;
  byte local_1d92;
  allocator local_1d91;
  string local_1d90 [37];
  byte local_1d6b;
  byte local_1d6a;
  allocator local_1d69;
  string local_1d68 [37];
  byte local_1d43;
  byte local_1d42;
  allocator local_1d41;
  string local_1d40 [37];
  byte local_1d1b;
  byte local_1d1a;
  allocator local_1d19;
  string local_1d18 [39];
  allocator local_1cf1;
  string local_1cf0 [39];
  allocator local_1cc9;
  string local_1cc8 [39];
  allocator local_1ca1;
  string local_1ca0 [359];
  allocator local_1b39;
  string local_1b38 [39];
  allocator local_1b11;
  string local_1b10 [359];
  allocator local_19a9;
  string local_19a8 [39];
  allocator local_1981;
  string local_1980 [216];
  vw *in_stack_ffffffffffffe758;
  options_i *in_stack_ffffffffffffe760;
  allocator local_1819;
  string local_1818 [39];
  allocator local_17f1;
  string local_17f0 [359];
  allocator local_1689;
  string local_1688 [32];
  undefined1 local_1668 [80];
  string local_1618 [39];
  allocator local_15f1;
  string local_15f0 [39];
  allocator local_15c9;
  string local_15c8 [359];
  allocator local_1461;
  string local_1460 [39];
  allocator local_1439;
  string local_1438 [359];
  allocator local_12d1;
  string local_12d0 [39];
  allocator local_12a9;
  string local_12a8 [359];
  allocator local_1141;
  string local_1140 [39];
  allocator local_1119;
  string local_1118 [359];
  allocator local_fb1;
  string local_fb0 [39];
  allocator local_f89;
  string local_f88 [359];
  allocator local_e21;
  string local_e20 [39];
  allocator local_df9;
  string local_df8 [359];
  allocator local_c91;
  string local_c90 [39];
  allocator local_c69;
  string local_c68 [39];
  allocator local_c41;
  string local_c40 [359];
  allocator local_ad9;
  string local_ad8 [32];
  undefined1 local_ab8 [63];
  allocator local_a79;
  string local_a78 [39];
  allocator local_a51;
  string local_a50 [359];
  allocator local_8e9;
  string local_8e8 [39];
  allocator local_8c1;
  string local_8c0 [359];
  allocator local_759;
  string local_758 [39];
  allocator local_731;
  string local_730 [359];
  allocator local_5c9;
  string local_5c8 [39];
  allocator local_5a1;
  string local_5a0 [359];
  allocator local_439;
  string local_438 [39];
  allocator local_411;
  string local_410 [39];
  allocator local_3e9;
  string local_3e8 [359];
  allocator local_281;
  string local_280 [32];
  undefined1 local_260 [63];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [359];
  allocator local_91;
  string local_90 [32];
  undefined1 local_70 [80];
  vw *local_20;
  undefined8 local_18;
  long local_10;
  string *local_8;
  
  iVar4 = (int)((ulong)in_stack_ffffffffffffdd30 >> 0x20);
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  pvVar5 = (vw *)operator_new(0x3658);
  vw::vw(in_stack_ffffffffffffde20);
  pvVar5->options = (options_i *)local_8;
  if (local_10 != 0) {
    *(long *)&(pvVar5->trace_message).super_ostream.field_0x80 = local_10;
    *(undefined8 *)&(pvVar5->trace_message).super_ostream.field_0x78 = local_18;
  }
  local_20 = pvVar5;
  time(&pvVar5->init_time);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"VW options",&local_91);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_ffffffffffffdd10,
             (string *)in_stack_ffffffffffffdd08);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"ring_size",&local_1f9);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffdd18,(unsigned_long *)in_stack_ffffffffffffdd10);
  VW::config::typed_option<unsigned_long>::default_value
            ((typed_option<unsigned_long> *)
             CONCAT17(in_stack_ffffffffffffdd27,in_stack_ffffffffffffdd20),
             (unsigned_long)in_stack_ffffffffffffdd18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"size of example ring",&local_221);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffdd10,
             (string *)in_stack_ffffffffffffdd08);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffdd10,
             (typed_option<unsigned_long> *)in_stack_ffffffffffffdd08);
  VW::config::option_group_definition::add<unsigned_long>
            (in_stack_ffffffffffffdd60,
             (typed_option<unsigned_long> *)
             CONCAT17(in_stack_ffffffffffffdd5f,in_stack_ffffffffffffdd58));
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffdd10);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffdd10);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  (***(_func_int ***)local_8)(local_8,local_70);
  ppVar6 = (parser *)operator_new(0x390);
  parser::parser((parser *)in_stack_ffffffffffffde20,in_stack_ffffffffffffde18);
  local_20->p = ppVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_280,"Update options",&local_281);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_ffffffffffffdd10,
             (string *)in_stack_ffffffffffffdd08);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e8,"learning_rate",&local_3e9);
  VW::config::make_option<float>(in_stack_ffffffffffffdd18,(float *)in_stack_ffffffffffffdd10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_410,"Set learning rate",&local_411);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffdd10,(string *)in_stack_ffffffffffffdd08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_438,"l",&local_439);
  VW::config::typed_option<float>::short_name
            ((typed_option<float> *)in_stack_ffffffffffffdd10,(string *)in_stack_ffffffffffffdd08);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_ffffffffffffdd10,
             (typed_option<float> *)in_stack_ffffffffffffdd08);
  VW::config::option_group_definition::add<float>
            (in_stack_ffffffffffffdd60,
             (typed_option<float> *)CONCAT17(in_stack_ffffffffffffdd5f,in_stack_ffffffffffffdd58));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5a0,"power_t",&local_5a1);
  VW::config::make_option<float>(in_stack_ffffffffffffdd18,(float *)in_stack_ffffffffffffdd10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5c8,"t power value",&local_5c9);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffdd10,(string *)in_stack_ffffffffffffdd08);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_ffffffffffffdd10,
             (typed_option<float> *)in_stack_ffffffffffffdd08);
  VW::config::option_group_definition::add<float>
            (in_stack_ffffffffffffdd60,
             (typed_option<float> *)CONCAT17(in_stack_ffffffffffffdd5f,in_stack_ffffffffffffdd58));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_730,"decay_learning_rate",&local_731);
  VW::config::make_option<float>(in_stack_ffffffffffffdd18,(float *)in_stack_ffffffffffffdd10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_758,"Set Decay factor for learning_rate between passes",&local_759);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffdd10,(string *)in_stack_ffffffffffffdd08);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_ffffffffffffdd10,
             (typed_option<float> *)in_stack_ffffffffffffdd08);
  VW::config::option_group_definition::add<float>
            (in_stack_ffffffffffffdd60,
             (typed_option<float> *)CONCAT17(in_stack_ffffffffffffdd5f,in_stack_ffffffffffffdd58));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8c0,"initial_t",&local_8c1);
  VW::config::make_option<double>(in_stack_ffffffffffffdd18,(double *)in_stack_ffffffffffffdd10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8e8,"initial t value",&local_8e9);
  VW::config::typed_option<double>::help
            ((typed_option<double> *)in_stack_ffffffffffffdd10,(string *)in_stack_ffffffffffffdd08);
  VW::config::typed_option<double>::typed_option
            ((typed_option<double> *)in_stack_ffffffffffffdd10,
             (typed_option<double> *)in_stack_ffffffffffffdd08);
  VW::config::option_group_definition::add<double>
            (in_stack_ffffffffffffdd60,
             (typed_option<double> *)CONCAT17(in_stack_ffffffffffffdd5f,in_stack_ffffffffffffdd58));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a50,"feature_mask",&local_a51);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffdd18,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdd10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a78,
             "Use existing regressor to determine which parameters may be updated.  If no initial_regressor given, also used for initial weights."
             ,&local_a79);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_ffffffffffffdd10,(string *)in_stack_ffffffffffffdd08);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(in_stack_ffffffffffffdd10,in_stack_ffffffffffffdd08);
  VW::config::option_group_definition::add<std::__cxx11::string>
            (in_stack_ffffffffffffdd60,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT17(in_stack_ffffffffffffdd5f,in_stack_ffffffffffffdd58));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffdd10);
  std::__cxx11::string::~string(local_a78);
  std::allocator<char>::~allocator((allocator<char> *)&local_a79);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffdd10);
  std::__cxx11::string::~string(local_a50);
  std::allocator<char>::~allocator((allocator<char> *)&local_a51);
  VW::config::typed_option<double>::~typed_option((typed_option<double> *)in_stack_ffffffffffffdd10)
  ;
  std::__cxx11::string::~string(local_8e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8e9);
  VW::config::typed_option<double>::~typed_option((typed_option<double> *)in_stack_ffffffffffffdd10)
  ;
  std::__cxx11::string::~string(local_8c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8c1);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffdd10);
  std::__cxx11::string::~string(local_758);
  std::allocator<char>::~allocator((allocator<char> *)&local_759);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffdd10);
  std::__cxx11::string::~string(local_730);
  std::allocator<char>::~allocator((allocator<char> *)&local_731);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffdd10);
  std::__cxx11::string::~string(local_5c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c9);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffdd10);
  std::__cxx11::string::~string(local_5a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffdd10);
  std::__cxx11::string::~string(local_438);
  std::allocator<char>::~allocator((allocator<char> *)&local_439);
  std::__cxx11::string::~string(local_410);
  std::allocator<char>::~allocator((allocator<char> *)&local_411);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffdd10);
  std::__cxx11::string::~string(local_3e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
  (***(_func_int ***)local_8)(local_8,local_260);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ad8,"Weight options",&local_ad9);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_ffffffffffffdd10,
             (string *)in_stack_ffffffffffffdd08);
  std::__cxx11::string::~string(local_ad8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ad9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c40,"initial_regressor",&local_c41);
  VW::config::make_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_ffffffffffffdd18,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffdd10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c68,"Initial regressor(s)",&local_c69);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::help((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_stack_ffffffffffffdd10,(string *)in_stack_ffffffffffffdd08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c90,"i",&local_c91);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::short_name((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffdd10,(string *)in_stack_ffffffffffffdd08);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffdd10,
                 (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffdd08);
  VW::config::option_group_definition::
  add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_ffffffffffffdd60,
             (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)CONCAT17(in_stack_ffffffffffffdd5f,in_stack_ffffffffffffdd58));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_df8,"initial_weight",&local_df9);
  VW::config::make_option<float>(in_stack_ffffffffffffdd18,(float *)in_stack_ffffffffffffdd10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e20,"Set all weights to an initial value of arg.",&local_e21);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffdd10,(string *)in_stack_ffffffffffffdd08);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_ffffffffffffdd10,
             (typed_option<float> *)in_stack_ffffffffffffdd08);
  VW::config::option_group_definition::add<float>
            (in_stack_ffffffffffffdd60,
             (typed_option<float> *)CONCAT17(in_stack_ffffffffffffdd5f,in_stack_ffffffffffffdd58));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f88,"random_weights",&local_f89);
  VW::config::make_option<bool>(in_stack_ffffffffffffdd18,(bool *)in_stack_ffffffffffffdd10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_fb0,"make initial weights random",&local_fb1);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffdd10,(string *)in_stack_ffffffffffffdd08);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_ffffffffffffdd10,
             (typed_option<bool> *)in_stack_ffffffffffffdd08);
  VW::config::option_group_definition::add<bool>
            (in_stack_ffffffffffffdd60,
             (typed_option<bool> *)CONCAT17(in_stack_ffffffffffffdd5f,in_stack_ffffffffffffdd58));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1118,"normal_weights",&local_1119);
  VW::config::make_option<bool>(in_stack_ffffffffffffdd18,(bool *)in_stack_ffffffffffffdd10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1140,"make initial weights normal",&local_1141);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffdd10,(string *)in_stack_ffffffffffffdd08);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_ffffffffffffdd10,
             (typed_option<bool> *)in_stack_ffffffffffffdd08);
  VW::config::option_group_definition::add<bool>
            (in_stack_ffffffffffffdd60,
             (typed_option<bool> *)CONCAT17(in_stack_ffffffffffffdd5f,in_stack_ffffffffffffdd58));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_12a8,"truncated_normal_weights",&local_12a9);
  VW::config::make_option<bool>(in_stack_ffffffffffffdd18,(bool *)in_stack_ffffffffffffdd10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_12d0,"make initial weights truncated normal",&local_12d1);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffdd10,(string *)in_stack_ffffffffffffdd08);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_ffffffffffffdd10,
             (typed_option<bool> *)in_stack_ffffffffffffdd08);
  VW::config::option_group_definition::add<bool>
            (in_stack_ffffffffffffdd60,
             (typed_option<bool> *)CONCAT17(in_stack_ffffffffffffdd5f,in_stack_ffffffffffffdd58));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1438,"sparse_weights",&local_1439);
  VW::config::make_option<bool>(in_stack_ffffffffffffdd18,(bool *)in_stack_ffffffffffffdd10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1460,"Use a sparse datastructure for weights",&local_1461);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffdd10,(string *)in_stack_ffffffffffffdd08);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_ffffffffffffdd10,
             (typed_option<bool> *)in_stack_ffffffffffffdd08);
  VW::config::option_group_definition::add<bool>
            (in_stack_ffffffffffffdd60,
             (typed_option<bool> *)CONCAT17(in_stack_ffffffffffffdd5f,in_stack_ffffffffffffdd58));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_15c8,"input_feature_regularizer",&local_15c9);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffdd18,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdd10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_15f0,"Per feature regularization input file",&local_15f1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_ffffffffffffdd10,(string *)in_stack_ffffffffffffdd08);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(in_stack_ffffffffffffdd10,in_stack_ffffffffffffdd08);
  VW::config::option_group_definition::add<std::__cxx11::string>
            (in_stack_ffffffffffffdd60,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT17(in_stack_ffffffffffffdd5f,in_stack_ffffffffffffdd58));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffdd10);
  std::__cxx11::string::~string(local_15f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_15f1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffdd10);
  std::__cxx11::string::~string(local_15c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_15c9);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffdd10);
  std::__cxx11::string::~string(local_1460);
  std::allocator<char>::~allocator((allocator<char> *)&local_1461);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffdd10);
  std::__cxx11::string::~string(local_1438);
  std::allocator<char>::~allocator((allocator<char> *)&local_1439);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffdd10);
  std::__cxx11::string::~string(local_12d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_12d1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffdd10);
  std::__cxx11::string::~string(local_12a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_12a9);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffdd10);
  std::__cxx11::string::~string(local_1140);
  std::allocator<char>::~allocator((allocator<char> *)&local_1141);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffdd10);
  std::__cxx11::string::~string(local_1118);
  std::allocator<char>::~allocator((allocator<char> *)&local_1119);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffdd10);
  std::__cxx11::string::~string(local_fb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_fb1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffdd10);
  std::__cxx11::string::~string(local_f88);
  std::allocator<char>::~allocator((allocator<char> *)&local_f89);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffdd10);
  std::__cxx11::string::~string(local_e20);
  std::allocator<char>::~allocator((allocator<char> *)&local_e21);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffdd10);
  std::__cxx11::string::~string(local_df8);
  std::allocator<char>::~allocator((allocator<char> *)&local_df9);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffdd10);
  std::__cxx11::string::~string(local_c90);
  std::allocator<char>::~allocator((allocator<char> *)&local_c91);
  std::__cxx11::string::~string(local_c68);
  std::allocator<char>::~allocator((allocator<char> *)&local_c69);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffdd10);
  std::__cxx11::string::~string(local_c40);
  std::allocator<char>::~allocator((allocator<char> *)&local_c41);
  (***(_func_int ***)local_8)(local_8,local_ab8);
  std::__cxx11::string::string(local_1618);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1688,"Parallelization options",&local_1689);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_ffffffffffffdd10,
             (string *)in_stack_ffffffffffffdd08);
  std::__cxx11::string::~string(local_1688);
  std::allocator<char>::~allocator((allocator<char> *)&local_1689);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_17f0,"span_server",&local_17f1);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffdd18,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdd10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1818,"Location of server for setting up spanning tree",&local_1819);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_ffffffffffffdd10,(string *)in_stack_ffffffffffffdd08);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(in_stack_ffffffffffffdd10,in_stack_ffffffffffffdd08);
  VW::config::option_group_definition::add<std::__cxx11::string>
            (in_stack_ffffffffffffdd60,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT17(in_stack_ffffffffffffdd5f,in_stack_ffffffffffffdd58));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1980,"unique_id",&local_1981);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffdd18,(unsigned_long *)in_stack_ffffffffffffdd10);
  VW::config::typed_option<unsigned_long>::default_value
            ((typed_option<unsigned_long> *)
             CONCAT17(in_stack_ffffffffffffdd27,in_stack_ffffffffffffdd20),
             (unsigned_long)in_stack_ffffffffffffdd18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_19a8,"unique id used for cluster parallel jobs",&local_19a9);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffdd10,
             (string *)in_stack_ffffffffffffdd08);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffdd10,
             (typed_option<unsigned_long> *)in_stack_ffffffffffffdd08);
  VW::config::option_group_definition::add<unsigned_long>
            (in_stack_ffffffffffffdd60,
             (typed_option<unsigned_long> *)
             CONCAT17(in_stack_ffffffffffffdd5f,in_stack_ffffffffffffdd58));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b10,"total",&local_1b11);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffdd18,(unsigned_long *)in_stack_ffffffffffffdd10);
  VW::config::typed_option<unsigned_long>::default_value
            ((typed_option<unsigned_long> *)
             CONCAT17(in_stack_ffffffffffffdd27,in_stack_ffffffffffffdd20),
             (unsigned_long)in_stack_ffffffffffffdd18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1b38,"total number of nodes used in cluster parallel job",&local_1b39);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffdd10,
             (string *)in_stack_ffffffffffffdd08);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffdd10,
             (typed_option<unsigned_long> *)in_stack_ffffffffffffdd08);
  VW::config::option_group_definition::add<unsigned_long>
            (in_stack_ffffffffffffdd60,
             (typed_option<unsigned_long> *)
             CONCAT17(in_stack_ffffffffffffdd5f,in_stack_ffffffffffffdd58));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1ca0,"node",&local_1ca1);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffdd18,(unsigned_long *)in_stack_ffffffffffffdd10);
  VW::config::typed_option<unsigned_long>::default_value
            ((typed_option<unsigned_long> *)
             CONCAT17(in_stack_ffffffffffffdd27,in_stack_ffffffffffffdd20),
             (unsigned_long)in_stack_ffffffffffffdd18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1cc8,"node number in cluster parallel job",&local_1cc9);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffdd10,
             (string *)in_stack_ffffffffffffdd08);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffdd10,
             (typed_option<unsigned_long> *)in_stack_ffffffffffffdd08);
  VW::config::option_group_definition::add<unsigned_long>
            (in_stack_ffffffffffffdd60,
             (typed_option<unsigned_long> *)
             CONCAT17(in_stack_ffffffffffffdd5f,in_stack_ffffffffffffdd58));
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffdd10);
  std::__cxx11::string::~string(local_1cc8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1cc9);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffdd10);
  std::__cxx11::string::~string(local_1ca0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ca1);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffdd10);
  std::__cxx11::string::~string(local_1b38);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b39);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffdd10);
  std::__cxx11::string::~string(local_1b10);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b11);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffdd10);
  std::__cxx11::string::~string(local_19a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_19a9);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffdd10);
  std::__cxx11::string::~string(local_1980);
  std::allocator<char>::~allocator((allocator<char> *)&local_1981);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffdd10);
  std::__cxx11::string::~string(local_1818);
  std::allocator<char>::~allocator((allocator<char> *)&local_1819);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffdd10);
  std::__cxx11::string::~string(local_17f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_17f1);
  (***(_func_int ***)local_8)(local_8,local_1668);
  psVar8 = local_8;
  std::allocator<char>::allocator();
  local_1d1a = 0;
  local_1d1b = 0;
  local_1d42 = 0;
  local_1d43 = 0;
  local_1d6a = 0;
  local_1d6b = 0;
  local_1d92 = 0;
  local_1d93 = 0;
  local_1dba = 0;
  local_1dbb = 0;
  std::__cxx11::string::string(local_1cf0,"total",&local_1cf1);
  uVar2 = (*(*(_func_int ***)psVar8)[1])(psVar8,local_1cf0);
  psVar8 = local_8;
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    local_1d1a = 1;
    std::__cxx11::string::string(local_1d18,"node",&local_1d19);
    local_1d1b = 1;
    uVar2 = (*(*(_func_int ***)psVar8)[1])(psVar8,local_1d18);
    psVar8 = local_8;
    if ((uVar2 & 1) == 0) {
      std::allocator<char>::allocator();
      local_1d42 = 1;
      std::__cxx11::string::string(local_1d40,"unique_id",&local_1d41);
      local_1d43 = 1;
      uVar2 = (*(*(_func_int ***)psVar8)[1])(psVar8,local_1d40);
      local_2272 = 0;
      if ((uVar2 & 1) == 0) goto LAB_001b2849;
    }
  }
  psVar8 = local_8;
  std::allocator<char>::allocator();
  local_1d6a = 1;
  std::__cxx11::string::string(local_1d68,"total",&local_1d69);
  local_1d6b = 1;
  uVar2 = (*(*(_func_int ***)psVar8)[1])(psVar8,local_1d68);
  local_228a = 0;
  if ((uVar2 & 1) != 0) {
    psVar8 = local_8;
    std::allocator<char>::allocator();
    local_1d92 = 1;
    std::__cxx11::string::string(local_1d90,"node",&local_1d91);
    local_1d93 = 1;
    uVar2 = (*(*(_func_int ***)psVar8)[1])(psVar8,local_1d90);
    local_228a = 0;
    if ((uVar2 & 1) != 0) {
      in_stack_ffffffffffffdd50 = (AllReduceSockets *)local_1db9;
      in_stack_ffffffffffffdd48 = local_8;
      std::allocator<char>::allocator();
      local_1dba = 1;
      std::__cxx11::string::string
                ((string *)(local_1db9 + 1),"unique_id",(allocator *)in_stack_ffffffffffffdd50);
      local_1dbb = 1;
      iVar3 = (*(*(_func_int ***)in_stack_ffffffffffffdd48)[1])
                        (in_stack_ffffffffffffdd48,local_1db9 + 1);
      in_stack_ffffffffffffdd47 = (byte)iVar3;
      local_228a = in_stack_ffffffffffffdd47;
    }
  }
  local_2272 = local_228a ^ 0xff;
LAB_001b2849:
  if ((local_1dbb & 1) != 0) {
    std::__cxx11::string::~string((string *)(local_1db9 + 1));
  }
  if ((local_1dba & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)local_1db9);
  }
  if ((local_1d93 & 1) != 0) {
    std::__cxx11::string::~string(local_1d90);
  }
  if ((local_1d92 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1d91);
  }
  if ((local_1d6b & 1) != 0) {
    std::__cxx11::string::~string(local_1d68);
  }
  if ((local_1d6a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1d69);
  }
  if ((local_1d43 & 1) != 0) {
    std::__cxx11::string::~string(local_1d40);
  }
  if ((local_1d42 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1d41);
  }
  if ((local_1d1b & 1) != 0) {
    std::__cxx11::string::~string(local_1d18);
  }
  if ((local_1d1a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1d19);
  }
  std::__cxx11::string::~string(local_1cf0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1cf1);
  if ((local_2272 & 1) != 0) {
    std::__cxx11::stringstream::stringstream(local_1f48);
    std::operator<<(&local_1f38,"you must specificy unique_id, total, and node if you specify any");
    local_1f69 = 1;
    pfile = (char *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              ((vw_exception *)
               CONCAT17(in_stack_ffffffffffffdd47,CONCAT16(local_2272,in_stack_ffffffffffffdd40)),
               pfile,iVar4,in_stack_ffffffffffffdd28);
    local_1f69 = 0;
    __cxa_throw(pfile,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  pnode = &local_1f91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f90,"span_server",pnode);
  iVar4 = (*(*(_func_int ***)local_8)[1])(local_8,local_1f90);
  bVar1 = (byte)iVar4;
  std::__cxx11::string::~string(local_1f90);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f91);
  if ((bVar1 & 1) != 0) {
    local_20->all_reduce_type = Socket;
    pAVar7 = (AllReduce *)operator_new(0x70);
    std::__cxx11::string::string(local_1fb8,local_1618);
    AllReduceSockets::AllReduceSockets
              (in_stack_ffffffffffffdd50,in_stack_ffffffffffffdd48,
               CONCAT17(in_stack_ffffffffffffdd47,CONCAT16(local_2272,in_stack_ffffffffffffdd40)),
               in_stack_ffffffffffffdd38,(size_t)pnode);
    local_20->all_reduce = pAVar7;
    std::__cxx11::string::~string(local_1fb8);
  }
  parse_diagnostics(in_stack_ffffffffffffe760,in_stack_ffffffffffffe758);
  local_20->initial_t = (float)local_20->sd->t;
  pvVar5 = local_20;
  VW::config::option_group_definition::~option_group_definition((option_group_definition *)local_20)
  ;
  std::__cxx11::string::~string(local_1618);
  VW::config::option_group_definition::~option_group_definition((option_group_definition *)pvVar5);
  VW::config::option_group_definition::~option_group_definition((option_group_definition *)pvVar5);
  VW::config::option_group_definition::~option_group_definition((option_group_definition *)pvVar5);
  return pvVar5;
}

Assistant:

vw& parse_args(options_i& options, trace_message_t trace_listener, void* trace_context)
{
  vw& all = *(new vw());
  all.options = &options;

  if (trace_listener)
  {
    all.trace_message.trace_listener = trace_listener;
    all.trace_message.trace_context = trace_context;
  }

  try
  {
    time(&all.init_time);

    size_t ring_size;
    option_group_definition vw_args("VW options");
    vw_args.add(make_option("ring_size", ring_size).default_value(256).help("size of example ring"));
    options.add_and_parse(vw_args);

    all.p = new parser{ring_size};

    option_group_definition update_args("Update options");
    update_args.add(make_option("learning_rate", all.eta).help("Set learning rate").short_name("l"))
        .add(make_option("power_t", all.power_t).help("t power value"))
        .add(make_option("decay_learning_rate", all.eta_decay_rate)
                 .help("Set Decay factor for learning_rate between passes"))
        .add(make_option("initial_t", all.sd->t).help("initial t value"))
        .add(make_option("feature_mask", all.feature_mask)
                 .help("Use existing regressor to determine which parameters may be updated.  If no initial_regressor "
                       "given, also used for initial weights."));
    options.add_and_parse(update_args);

    option_group_definition weight_args("Weight options");
    weight_args
        .add(make_option("initial_regressor", all.initial_regressors).help("Initial regressor(s)").short_name("i"))
        .add(make_option("initial_weight", all.initial_weight).help("Set all weights to an initial value of arg."))
        .add(make_option("random_weights", all.random_weights).help("make initial weights random"))
        .add(make_option("normal_weights", all.normal_weights).help("make initial weights normal"))
        .add(make_option("truncated_normal_weights", all.tnormal_weights).help("make initial weights truncated normal"))
        .add(make_option("sparse_weights", all.weights.sparse).help("Use a sparse datastructure for weights"))
        .add(make_option("input_feature_regularizer", all.per_feature_regularizer_input)
                 .help("Per feature regularization input file"));
    options.add_and_parse(weight_args);

    std::string span_server_arg;
    // bool threads_arg;
    size_t unique_id_arg;
    size_t total_arg;
    size_t node_arg;
    option_group_definition parallelization_args("Parallelization options");
    parallelization_args
        .add(make_option("span_server", span_server_arg).help("Location of server for setting up spanning tree"))
        //(make_option("threads", threads_arg).help("Enable multi-threading")) Unused option?
        .add(make_option("unique_id", unique_id_arg).default_value(0).help("unique id used for cluster parallel jobs"))
        .add(
            make_option("total", total_arg).default_value(1).help("total number of nodes used in cluster parallel job"))
        .add(make_option("node", node_arg).default_value(0).help("node number in cluster parallel job"));
    options.add_and_parse(parallelization_args);

    // total, unique_id and node must be specified together.
    if ((options.was_supplied("total") || options.was_supplied("node") || options.was_supplied("unique_id")) &&
        !(options.was_supplied("total") && options.was_supplied("node") && options.was_supplied("unique_id")))
    {
      THROW("you must specificy unique_id, total, and node if you specify any");
    }

    if (options.was_supplied("span_server"))
    {
      all.all_reduce_type = AllReduceType::Socket;
      all.all_reduce = new AllReduceSockets(span_server_arg, unique_id_arg, total_arg, node_arg);
    }

    parse_diagnostics(options, all);

    all.initial_t = (float)all.sd->t;
    return all;
  }
  catch (...)
  {
    VW::finish(all);
    throw;
  }
}